

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5504af::TransformSelectorAt::~TransformSelectorAt(TransformSelectorAt *this)

{
  TransformSelectorIndexes::~TransformSelectorIndexes(&this->super_TransformSelectorIndexes);
  operator_delete(this,0x40);
  return;
}

Assistant:

TransformSelectorAt(std::vector<int>&& indexes)
    : TransformSelectorIndexes("AT", std::move(indexes))
  {
  }